

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
          anon_class_16_2_164db4ee comp)

{
  int iVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  ComponentData *pCVar4;
  int iVar5;
  
  pCVar4 = comp.componentData;
  iVar5 = *(int *)this;
  HVar2 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*a._M_current]);
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar5]);
  iVar5 = *(int *)(*(long *)c._M_current + (long)HVar2 * 4);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  if ((iVar5 == 1) || (iVar1 != 1)) {
    if ((HVar2 < HVar3) && (iVar5 != 1 || iVar1 == 1)) goto LAB_002ff668;
    iVar5 = *a._M_current;
  }
  else {
LAB_002ff668:
    iVar5 = *(int *)this;
    *(int *)this = *a._M_current;
    *a._M_current = iVar5;
  }
  HVar2 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*b._M_current]);
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar5]);
  iVar5 = *(int *)(*(long *)c._M_current + (long)HVar2 * 4);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  if ((iVar5 == 1) || (iVar1 != 1)) {
    if ((HVar3 <= HVar2) || (iVar5 == 1 && iVar1 != 1)) goto LAB_002ff6e3;
  }
  iVar5 = *a._M_current;
  *a._M_current = *b._M_current;
  *b._M_current = iVar5;
LAB_002ff6e3:
  iVar5 = *(int *)this;
  HVar2 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[*a._M_current]);
  HVar3 = HighsDisjointSets<false>::getSet
                    ((HighsDisjointSets<false> *)c._M_current,
                     (pCVar4->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish[iVar5]);
  iVar5 = *(int *)(*(long *)c._M_current + (long)HVar2 * 4);
  iVar1 = *(int *)(*(long *)c._M_current + (long)HVar3 * 4);
  if ((iVar5 == 1) || (iVar1 != 1)) {
    if (HVar3 <= HVar2) {
      return;
    }
    if (iVar5 == 1 && iVar1 != 1) {
      return;
    }
  }
  iVar5 = *(int *)this;
  *(int *)this = *a._M_current;
  *a._M_current = iVar5;
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }